

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManStop(Gli_Man_t *p)

{
  Vec_IntFree(p->vCis);
  Vec_IntFree(p->vCos);
  Vec_IntFree(p->vCisChanged);
  Vec_IntFree(p->vAffected);
  Vec_IntFree(p->vFrontier);
  free(p->pSimInfoPrev);
  free(p);
  return;
}

Assistant:

void Gli_ManStop( Gli_Man_t * p )
{
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    Vec_IntFree( p->vCisChanged );
    Vec_IntFree( p->vAffected );
    Vec_IntFree( p->vFrontier );
    ABC_FREE( p->pSimInfoPrev );
    ABC_FREE( p );
}